

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  long lVar1;
  uint uVar2;
  undefined8 this_00;
  bool bVar3;
  Type TVar4;
  CppType CVar5;
  GeneratorOptions *pGVar6;
  GeneratorOptions *options_00;
  string *psVar7;
  Descriptor *pDVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_04;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  char *pcVar11;
  char *field_05;
  Printer *this_01;
  BytesMode BVar12;
  undefined1 uVar13;
  FieldDescriptor *pFVar14;
  ulong uVar15;
  undefined1 in_stack_fffffffffffffec8;
  string value_type;
  undefined1 local_108 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string key_type;
  string local_a0;
  string local_80;
  GeneratorOptions *local_60;
  char *local_58;
  string local_50;
  
  pFVar14 = field;
  bVar3 = FieldDescriptor::is_map(field);
  local_108._32_8_ = printer;
  if (bVar3) {
    pGVar6 = (GeneratorOptions *)anon_unknown_0::MapFieldKey(field);
    options_00 = (GeneratorOptions *)anon_unknown_0::MapFieldValue(field);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,pGVar6,(FieldDescriptor *)0x0,true,false,
               false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffec8);
    pFVar14 = (FieldDescriptor *)0x0;
    local_60 = options_00;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,options_00,(FieldDescriptor *)0x0,true,
               false,false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffec8);
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               pFVar14);
    BVar12 = 0x394bbc;
    pbVar9 = &key_type;
    psVar7 = &value_type;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              ((Printer *)local_108._32_8_,
               "/**\n * $fielddef$\n * @param {boolean=} opt_noLazyCreate Do not create the map if\n * empty, instead returning `undefined`\n * @return {!jspb.Map<$keytype$,$valuetype$>}\n */\n"
               ,(char (*) [9])"fielddef",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
               (char (*) [8])"keytype",&key_type,(char (*) [10])"valuetype",&value_type);
    uVar13 = SUB81(pbVar9,0);
    std::__cxx11::string::~string((string *)local_108);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x50),(Descriptor *)psVar7);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_108 + 0x28),"get",&local_a0);
    printer = (Printer *)local_108._32_8_;
    BVar12 = 0x394c48;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 0x28)
    ;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              ((Printer *)local_108._32_8_,
               "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n"
               ,(char (*) [6])0x39aeed,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
               (char (*) [11])"gettername",pbVar9,(char (*) [8])"keytype",&key_type,
               (char (*) [10])"valuetype",&value_type);
    uVar13 = SUB81(pbVar9,0);
    std::__cxx11::string::~string((string *)(local_108 + 0x28));
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_108);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"gettername",field);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)field,field_00);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,"      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
               (char (*) [6])0x3a0f1a,pbVar9);
    std::__cxx11::string::~string((string *)local_108);
    TVar4 = FieldDescriptor::type((FieldDescriptor *)local_60);
    if (TVar4 == TYPE_MESSAGE) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_60);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_108,(_anonymous_namespace_ *)options,pGVar6,(Descriptor *)pbVar9);
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,",\n      $messageType$",(char (*) [12])"messageType",pbVar9);
      std::__cxx11::string::~string((string *)local_108);
    }
    else {
      io::Printer::Print<>(printer,",\n      null");
    }
    io::Printer::Print<>(printer,"));\n");
    field_05 = "};\n\n\n";
    io::Printer::Print<>(printer,"};\n\n\n");
    std::__cxx11::string::~string((string *)&value_type);
LAB_0028a7a2:
    std::__cxx11::string::~string((string *)&key_type);
  }
  else {
    CVar5 = FieldDescriptor::cpp_type(field);
    if (CVar5 != CPPTYPE_MESSAGE) {
      TVar4 = FieldDescriptor::type(field);
      uVar2 = options->binary ^ 1;
      if (TVar4 != TYPE_BYTES) {
        uVar2 = 0;
      }
      psVar7 = &key_type;
      pFVar14 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (psVar7,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,false,false,SUB41(uVar2,0),BYTES_DEFAULT,
                 (bool)in_stack_fffffffffffffec8);
      (anonymous_namespace)::FieldDefinition_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar14);
      (anonymous_namespace)::FieldComments_abi_cxx11_
                ((string *)local_108,(_anonymous_namespace_ *)field,(FieldDescriptor *)(ulong)uVar2,
                 (BytesMode)pFVar14);
      BVar12 = 0x3d411c;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      io::Printer::
      Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
                (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
                 (char (*) [9])"fielddef",&value_type,(char (*) [8])0x3d411c,pbVar9,
                 (char (*) [5])0x3e3693,psVar7);
      uVar13 = SUB81(pbVar9,0);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&value_type);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 (Descriptor *)psVar7);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0
                 ,(FieldDescriptor *)0x0,BVar12,(bool)uVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "get",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_108 + 0x28));
      io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"$class$.prototype.$gettername$ = function() {\n",(char (*) [6])0x39aeed,
                 &value_type,(char (*) [11])"gettername",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(local_108 + 0x28));
      std::__cxx11::string::~string((string *)&value_type);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"gettername",field);
      pcVar11 = "  return /** @type {$type$} */ (";
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"  return /** @type {$type$} */ (",(char (*) [5])0x3e3693,&key_type);
      pFVar14 = field;
      bVar3 = anon_unknown_0::ReturnsNullWhenUnset
                        ((GeneratorOptions *)field,(FieldDescriptor *)pcVar11);
      pDVar8 = (Descriptor *)field;
      GenerateFieldValueExpression
                ((Generator *)pFVar14,printer,"this",field,*(int *)(field + 0x3c) != 3 && !bVar3);
      io::Printer::Print<>(printer,");\n};\n\n\n");
      TVar4 = FieldDescriptor::type(field);
      if (TVar4 == TYPE_BYTES) {
        GenerateBytesWrapper(options,printer,field,BYTES_B64);
        pDVar8 = (Descriptor *)0x2;
        GenerateBytesWrapper(options,printer,field,BYTES_U8);
      }
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 pDVar8);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_108,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
                 (bool)in_stack_fffffffffffffec8);
      pcVar11 = "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n";
      BVar12 = 0x394e74;
      pbVar9 = &value_type;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      io::Printer::Print<char[6],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,
                 "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n",
                 (char (*) [6])0x39aeed,pbVar9,(char (*) [13])"optionaltype",pbVar10);
      uVar13 = SUB81(pbVar10,0);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&value_type);
      if ((((*(int *)(*(long *)(field + 0x28) + 0x3c) != 3) || (*(int *)(field + 0x3c) == 3)) ||
          (bVar3 = FieldDescriptor::is_map(field), bVar3)) ||
         (bVar3 = anon_unknown_0::HasFieldPresence
                            ((GeneratorOptions *)field,(FieldDescriptor *)pcVar11), bVar3)) {
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50)
                   ,(Descriptor *)pbVar9);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,
                   (GeneratorOptions *)0x0,(FieldDescriptor *)0x0,BVar12,(bool)uVar13);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"set",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_108 + 0x28));
        pcVar11 = "";
        local_80._M_dataplus._M_p = "Oneof";
        if (*(long *)(field + 0x58) == 0) {
          local_80._M_dataplus._M_p = "";
        }
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)field,field_03);
        pbVar9 = &value_type;
        io::Printer::
        Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[6],std::__cxx11::string>
                  (printer,
                   "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$Field(this, $index$"
                   ,(char (*) [6])0x39aeed,pbVar9,(char (*) [11])"settername",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (char (*) [9])"oneoftag",(char **)&local_80,(char (*) [6])0x3a0f1a,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string((string *)(local_108 + 0x28));
        std::__cxx11::string::~string((string *)&value_type);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"settername",field);
        local_e0._M_dataplus._M_p = "";
        local_a0._M_dataplus._M_p = "";
        lVar1 = *(long *)(field + 0x58);
        if (lVar1 == 0) {
          std::__cxx11::string::string((string *)&value_type,"",(allocator *)local_108);
        }
        else {
          (anonymous_namespace)::JSOneofArray_abi_cxx11_
                    ((string *)local_108,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                     (FieldDescriptor *)pbVar9);
          std::operator+(&value_type,", ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
        }
        if (*(int *)(field + 0x3c) == 3) {
          pcVar11 = " || []";
        }
        field_05 = "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n";
        BVar12 = 0x395098;
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_108 + 0x28);
        psVar7 = &local_a0;
        local_80._M_dataplus._M_p = pcVar11;
        io::Printer::
        Print<char[5],char_const*,char[10],char_const*,char[11],std::__cxx11::string,char[13],char_const*>
                  (printer,"$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n",
                   (char (*) [5])0x3e3693,(char **)pbVar9,(char (*) [10])"typeclose",(char **)psVar7
                   ,(char (*) [11])0x395373,&value_type,(char (*) [13])"rptvalueinit",
                   (char **)&local_80);
        uVar13 = SUB81(psVar7,0);
        this_01 = (Printer *)&value_type;
        std::__cxx11::string::~string((string *)this_01);
        if (lVar1 != 0) {
          this_01 = (Printer *)local_108;
          std::__cxx11::string::~string((string *)this_01);
        }
      }
      else {
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50)
                   ,(Descriptor *)pbVar9);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,
                   (GeneratorOptions *)0x0,(FieldDescriptor *)0x0,BVar12,(bool)uVar13);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"set",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_108 + 0x28));
        TVar4 = FieldDescriptor::type(field);
        switch(TVar4) {
        case TYPE_DOUBLE:
        case TYPE_FLOAT:
          std::__cxx11::string::string((string *)&local_a0,"Float",(allocator *)&local_80);
          pFVar14 = extraout_RDX_03;
          break;
        case TYPE_INT64:
        case TYPE_UINT64:
        case TYPE_INT32:
        case TYPE_FIXED64:
        case TYPE_FIXED32:
        case TYPE_UINT32:
        case TYPE_SFIXED32:
        case TYPE_SFIXED64:
        case TYPE_SINT32:
        case MAX_TYPE:
          bVar3 = anon_unknown_0::IsIntegralFieldWithStringJSType(field);
          if (bVar3) {
            std::__cxx11::string::string((string *)&local_a0,"StringInt",(allocator *)&local_80);
            pFVar14 = extraout_RDX_01;
          }
          else {
            std::__cxx11::string::string((string *)&local_a0,"Int",(allocator *)&local_80);
            pFVar14 = extraout_RDX_02;
          }
          break;
        case TYPE_BOOL:
          std::__cxx11::string::string((string *)&local_a0,"Boolean",(allocator *)&local_80);
          pFVar14 = extraout_RDX_05;
          break;
        case TYPE_STRING:
          std::__cxx11::string::string((string *)&local_a0,"String",(allocator *)&local_80);
          pFVar14 = extraout_RDX_04;
          break;
        default:
          std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_80);
          pFVar14 = extraout_RDX_08;
          break;
        case TYPE_BYTES:
          std::__cxx11::string::string((string *)&local_a0,"Bytes",(allocator *)&local_80);
          pFVar14 = extraout_RDX_06;
          break;
        case TYPE_ENUM:
          std::__cxx11::string::string((string *)&local_a0,"Enum",(allocator *)&local_80);
          pFVar14 = extraout_RDX_07;
        }
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_80,(_anonymous_namespace_ *)field,pFVar14);
        BVar12 = 0x394e81;
        pbVar9 = &value_type;
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
        io::Printer::
        Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[6],std::__cxx11::string>
                  (printer,
                   "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.setProto3$typetag$Field(this, $index$, value);\n};\n\n\n"
                   ,(char (*) [6])0x39aeed,pbVar9,(char (*) [11])"settername",pbVar10,
                   (char (*) [8])"typetag",&local_a0,(char (*) [6])0x3a0f1a,&local_80);
        uVar13 = SUB81(pbVar10,0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string((string *)(local_108 + 0x28));
        std::__cxx11::string::~string((string *)&value_type);
        field_05 = "settername";
        this_01 = printer;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"settername",field);
      }
      if (*(int *)(field + 0x3c) == 3) {
        BVar12 = BYTES_DEFAULT;
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field;
        field_05 = (char *)options;
        GenerateRepeatedPrimitiveHelperMethods((Generator *)this_01,options,printer,field,false);
      }
      goto LAB_0028a7a2;
    }
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar14);
    (anonymous_namespace)::FieldComments_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,(BytesMode)pFVar14)
    ;
    psVar7 = (string *)local_108;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (psVar7,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_fffffffffffffec8);
    BVar12 = 0x3d411c;
    pbVar9 = &value_type;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
               (char (*) [9])"fielddef",&key_type,(char (*) [8])0x3d411c,pbVar9,
               (char (*) [5])0x3e3693,psVar7);
    uVar13 = SUB81(pbVar9,0);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&value_type);
    std::__cxx11::string::~string((string *)&key_type);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)psVar7);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    uVar15 = 0;
    std::operator+(&value_type,"get",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    pFVar14 = (FieldDescriptor *)(uVar15 & 0xffffffff00000000);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)options,
               (GeneratorOptions *)field,(FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_fffffffffffffec8);
    pcVar11 = "Repeated";
    local_50._M_dataplus._M_p = "";
    if (*(int *)(field + 0x3c) == 3) {
      local_50._M_dataplus._M_p = "Repeated";
    }
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)field,field_01);
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar14);
    this_00 = local_108._32_8_;
    local_58 = ", 1";
    if (*(int *)(field + 0x3c) != 2) {
      local_58 = "";
    }
    io::Printer::
    Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[5],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[13],std::__cxx11::string,char[9],char_const*>
              ((Printer *)local_108._32_8_,
               "$class$.prototype.$gettername$ = function() {\n  return /** @type{$type$} */ (\n    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, $index$$required$));\n};\n\n\n"
               ,(char (*) [6])0x39aeed,&key_type,(char (*) [11])"gettername",&value_type,
               (char (*) [5])0x3e3693,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_108 + 0x28),(char (*) [4])"rpt",(char **)&local_50,(char (*) [6])0x3a0f1a,
               &local_a0,(char (*) [13])"wrapperclass",&local_80,(char (*) [9])"required",&local_58)
    ;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)(local_108 + 0x28));
    std::__cxx11::string::~string((string *)&value_type);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&key_type);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>((Printer *)this_00,"gettername",field);
    pDVar8 = (Descriptor *)0x1;
    BVar12 = BYTES_DEFAULT;
    uVar13 = 0;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_fffffffffffffec8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               pDVar8);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "set",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_108 + 0x28));
    local_a0._M_dataplus._M_p = "Oneof";
    if (*(long *)(field + 0x58) == 0) {
      local_a0._M_dataplus._M_p = "";
    }
    if (*(int *)(field + 0x3c) != 3) {
      pcVar11 = "";
    }
    pbVar9 = &key_type;
    local_80._M_dataplus._M_p = pcVar11;
    io::Printer::
    Print<char[13],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[12],char_const*>
              ((Printer *)this_00,
               "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n*/\n$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField("
               ,(char (*) [13])"optionaltype",pbVar9,(char (*) [6])0x39aeed,&value_type,
               (char (*) [11])"settername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
               (char (*) [9])"oneoftag",(char **)&local_a0,(char (*) [12])"repeatedtag",
               (char **)&local_80);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)(local_108 + 0x28));
    std::__cxx11::string::~string((string *)&value_type);
    std::__cxx11::string::~string((string *)&key_type);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>((Printer *)this_00,"settername",field);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)field,field_02);
    lVar1 = *(long *)(field + 0x58);
    if (lVar1 == 0) {
      std::__cxx11::string::string((string *)&value_type,"",(allocator *)local_108);
    }
    else {
      (anonymous_namespace)::JSOneofArray_abi_cxx11_
                ((string *)local_108,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)pbVar9);
      std::operator+(&value_type,", ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
    }
    field_05 = "this, $index$$oneofgroup$, value);\n};\n\n\n";
    BVar12 = 0x395373;
    pbVar9 = &key_type;
    pbVar10 = &value_type;
    io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)local_108._32_8_,"this, $index$$oneofgroup$, value);\n};\n\n\n",
               (char (*) [6])0x3a0f1a,pbVar9,(char (*) [11])0x395373,pbVar10);
    uVar13 = SUB81(pbVar10,0);
    std::__cxx11::string::~string((string *)&value_type);
    if (lVar1 != 0) {
      std::__cxx11::string::~string((string *)local_108);
    }
    printer = (Printer *)local_108._32_8_;
    psVar7 = &key_type;
    std::__cxx11::string::~string((string *)psVar7);
    if (*(int *)(field + 0x3c) == 3) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field;
      field_05 = (char *)options;
      GenerateRepeatedMessageHelperMethods((Generator *)psVar7,options,printer,field);
    }
  }
  bVar3 = FieldDescriptor::is_map(field);
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)pbVar9);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    std::operator+(&value_type,"clear",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_108 + 0x28));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    pbVar9 = &local_a0;
    std::operator+(pbVar9,"get",&local_80);
    BVar12 = 0x39517c;
    pbVar10 = &value_type;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "/**\n * Clears values from the map. The map will be non-null.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  this.$gettername$().clear();\n  return this;};\n\n\n"
               ,(char (*) [6])0x39aeed,&key_type,(char (*) [12])"clearername",pbVar10,
               (char (*) [11])"gettername",pbVar9);
    uVar13 = SUB81(pbVar10,0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&value_type);
    std::__cxx11::string::~string((string *)(local_108 + 0x28));
    std::__cxx11::string::~string((string *)&key_type);
    field_05 = "clearername";
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"clearername",field);
    goto LAB_0028abdb;
  }
  if (*(int *)(field + 0x3c) == 3) {
LAB_0028a8b5:
    pbVar10 = pbVar9;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "Clears the list making it empty but non-null.";
  }
  else {
    CVar5 = FieldDescriptor::cpp_type(field);
    if ((CVar5 != CPPTYPE_MESSAGE) || (*(int *)(field + 0x3c) == 2)) {
      bVar3 = anon_unknown_0::HasFieldPresence
                        ((GeneratorOptions *)field,(FieldDescriptor *)field_05);
      if (bVar3) {
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                   (Descriptor *)pbVar9);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,
                   (GeneratorOptions *)0x0,(FieldDescriptor *)0x0,BVar12,(bool)uVar13);
        std::operator+(&value_type,"clear",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_108 + 0x28));
        lVar1 = *(long *)(field + 0x58);
        local_58 = "Oneof";
        if (lVar1 == 0) {
          local_58 = "";
          std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_80);
          pFVar14 = extraout_RDX_00;
        }
        else {
          (anonymous_namespace)::JSOneofArray_abi_cxx11_
                    (&local_80,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                     (FieldDescriptor *)"Oneof");
          std::operator+(&local_a0,", ",&local_80);
          pFVar14 = extraout_RDX;
        }
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)field,pFVar14);
        BVar12 = 0x39517c;
        pbVar9 = &value_type;
        io::Printer::
        Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],char_const*,char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                  ((Printer *)local_108._32_8_,
                   "/**\n * Clears the field making it undefined.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return jspb.Message.set$maybeoneof$Field(this, $index$$maybeoneofgroup$, "
                   ,(char (*) [6])0x39aeed,&key_type,(char (*) [12])"clearername",pbVar9,
                   (char (*) [11])"maybeoneof",&local_58,(char (*) [16])"maybeoneofgroup",&local_a0,
                   (char (*) [6])0x3a0f1a,&local_50);
        uVar13 = SUB81(pbVar9,0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_a0);
        if (lVar1 != 0) {
          std::__cxx11::string::~string((string *)&local_80);
        }
        printer = (Printer *)local_108._32_8_;
        std::__cxx11::string::~string((string *)&value_type);
        std::__cxx11::string::~string((string *)(local_108 + 0x28));
        std::__cxx11::string::~string((string *)&key_type);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"clearername",field);
        key_type._M_dataplus._M_p = "undefined";
        if (*(int *)(field + 0x3c) == 3) {
          key_type._M_dataplus._M_p = "[]";
        }
        field_05 = "$clearedvalue$);\n};\n\n\n";
        pbVar9 = &key_type;
        io::Printer::Print<char[13],char_const*>
                  (printer,"$clearedvalue$);\n};\n\n\n",(char (*) [13])"clearedvalue",
                   (char **)pbVar9);
      }
      goto LAB_0028abdb;
    }
    if (*(int *)(field + 0x3c) == 3) goto LAB_0028a8b5;
    pbVar10 = pbVar9;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "Clears the message field making it undefined.";
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
             (Descriptor *)pbVar10);
  (anonymous_namespace)::JSGetterName_abi_cxx11_
            ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
             (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
  std::operator+(&value_type,"clear",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_108 + 0x28));
  (anonymous_namespace)::JSGetterName_abi_cxx11_
            (&local_80,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0
             ,BVar12,(bool)uVar13);
  std::operator+(&local_a0,"set",&local_80);
  printer = (Printer *)local_108._32_8_;
  local_50._M_dataplus._M_p = "undefined";
  if (*(int *)(field + 0x3c) == 3) {
    local_50._M_dataplus._M_p = "[]";
  }
  BVar12 = 0x39aeed;
  pbVar10 = &key_type;
  io::Printer::
  Print<char[6],char[46],char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string,char[13],char_const*>
            ((Printer *)local_108._32_8_,
             "/**\n * $jsdoc$\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return this.$settername$($clearedvalue$);\n};\n\n\n"
             ,(char (*) [6])"jsdoc",(char (*) [46])pbVar9,(char (*) [6])0x39aeed,pbVar10,
             (char (*) [12])"clearername",&value_type,(char (*) [11])"settername",&local_a0,
             (char (*) [13])"clearedvalue",(char **)&local_50);
  uVar13 = SUB81(pbVar10,0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&value_type);
  std::__cxx11::string::~string((string *)(local_108 + 0x28));
  std::__cxx11::string::~string((string *)&key_type);
  field_05 = "clearername";
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"clearername",field);
LAB_0028abdb:
  bVar3 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)field_05);
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)pbVar9);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)(local_108 + 0x28),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar12,(bool)uVar13);
    std::operator+(&value_type,"has",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_108 + 0x28));
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)field,field_04);
    io::Printer::
    Print<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,
               "/**\n * Returns whether this field is set.\n * @return {boolean}\n */\n$class$.prototype.$hasername$ = function() {\n  return jspb.Message.getField(this, $index$) != null;\n};\n\n\n"
               ,(char (*) [6])0x39aeed,&key_type,(char (*) [10])"hasername",&value_type,
               (char (*) [6])0x3a0f1a,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&value_type);
    std::__cxx11::string::~string((string *)(local_108 + 0x28));
    std::__cxx11::string::~string((string *)&key_type);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"hasername",field);
  }
  return;
}

Assistant:

void Generator::GenerateClassField(const GeneratorOptions& options,
                                   io::Printer* printer,
                                   const FieldDescriptor* field) const {
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    // Map field: special handling to instantiate the map object on demand.
    std::string key_type =
        JSFieldTypeAnnotation(options, key_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);
    std::string value_type =
        JSFieldTypeAnnotation(options, value_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        " * @param {boolean=} opt_noLazyCreate Do not create the map if\n"
        " * empty, instead returning `undefined`\n"
        " * @return {!jspb.Map<$keytype$,$valuetype$>}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Print(
        "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n"
        "  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Annotate("gettername", field);
    printer->Print(
        "      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
        "index", JSFieldIndex(field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(
          ",\n"
          "      $messageType$",
          "messageType", GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(
          ",\n"
          "      null");
    }

    printer->Print("));\n");

    printer->Print(
        "};\n"
        "\n"
        "\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field: special handling in order to wrap the underlying data
    // array with a message object.

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        "$comment$"
        " * @return {$type$}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "comment",
        FieldComments(field, BYTES_DEFAULT), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false));
    printer->Print(
        "$class$.prototype.$gettername$ = function() {\n"
        "  return /** @type{$type$} */ (\n"
        "    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, "
        "$index$$required$));\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "rpt", (field->is_repeated() ? "Repeated" : ""), "index",
        JSFieldIndex(field), "wrapperclass", SubmessageTypeRef(options, field),
        "required",
        (field->label() == FieldDescriptor::LABEL_REQUIRED ? ", 1" : ""));
    printer->Annotate("gettername", field);
    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        "*/\n"
        "$class$.prototype.$settername$ = function(value) {\n"
        "  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField(",
        "optionaltype",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ true,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "class", GetMessagePath(options, field->containing_type()),
        "settername", "set" + JSGetterName(options, field), "oneoftag",
        (field->containing_oneof() ? "Oneof" : ""), "repeatedtag",
        (field->is_repeated() ? "Repeated" : ""));
    printer->Annotate("settername", field);

    printer->Print(
        "this, $index$$oneofgroup$, value);\n"
        "};\n"
        "\n"
        "\n",
        "index", JSFieldIndex(field), "oneofgroup",
        (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                   : ""));

    if (field->is_repeated()) {
      GenerateRepeatedMessageHelperMethods(options, printer, field);
    }

  } else {
    bool untyped =
        false;

    // Simple (primitive) field, either singular or repeated.

    // TODO(b/26173701): Always use BYTES_DEFAULT for the getter return type;
    // at this point we "lie" to non-binary users and tell the return
    // type is always base64 string, pending a LSC to migrate to typed getters.
    BytesMode bytes_mode =
        field->type() == FieldDescriptor::TYPE_BYTES && !options.binary
            ? BYTES_B64
            : BYTES_DEFAULT;
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ bytes_mode);
    if (untyped) {
      printer->Print(
          "/**\n"
          " * @return {?} Raw field, untyped.\n"
          " */\n");
    } else {
      printer->Print(
          "/**\n"
          " * $fielddef$\n"
          "$comment$"
          " * @return {$type$}\n"
          " */\n",
          "fielddef", FieldDefinition(options, field), "comment",
          FieldComments(field, bytes_mode), "type", typed_annotation);
    }

    printer->Print("$class$.prototype.$gettername$ = function() {\n", "class",
                   GetMessagePath(options, field->containing_type()),
                   "gettername", "get" + JSGetterName(options, field));
    printer->Annotate("gettername", field);

    if (untyped) {
      printer->Print("  return ");
    } else {
      printer->Print("  return /** @type {$type$} */ (", "type",
                     typed_annotation);
    }

    bool use_default = !ReturnsNullWhenUnset(options, field);

    // Raw fields with no default set should just return undefined.
    if (untyped && !field->has_default_value()) {
      use_default = false;
    }

    // Repeated fields get initialized to their default in the constructor
    // (why?), so we emit a plain getField() call for them.
    if (field->is_repeated()) {
      use_default = false;
    }

    GenerateFieldValueExpression(printer, "this", field, use_default);

    if (untyped) {
      printer->Print(
          ";\n"
          "};\n"
          "\n"
          "\n");
    } else {
      printer->Print(
          ");\n"
          "};\n"
          "\n"
          "\n");
    }

    if (field->type() == FieldDescriptor::TYPE_BYTES && !untyped) {
      GenerateBytesWrapper(options, printer, field, BYTES_B64);
      GenerateBytesWrapper(options, printer, field, BYTES_U8);
    }

    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        " */\n",
        "class", GetMessagePath(options, field->containing_type()),
        "optionaltype",
        untyped ? "*"
                : JSFieldTypeAnnotation(options, field,
                                        /* is_setter_argument = */ true,
                                        /* force_present = */ false,
                                        /* singular_if_not_packed = */ false));

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        !field->is_repeated() && !field->is_map() &&
        !HasFieldPresence(options, field)) {
      // Proto3 non-repeated and non-map fields without presence use the
      // setProto3*Field function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.setProto3$typetag$Field(this, $index$, "
          "value);"
          "\n"
          "};\n"
          "\n"
          "\n",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "typetag",
          JSTypeTag(field), "index", JSFieldIndex(field));
      printer->Annotate("settername", field);
    } else {
      // Otherwise, use the regular setField function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.set$oneoftag$Field(this, $index$",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "oneoftag",
          (field->containing_oneof() ? "Oneof" : ""), "index",
          JSFieldIndex(field));
      printer->Annotate("settername", field);
      printer->Print(
          "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n"
          "};\n"
          "\n"
          "\n",
          "type",
          untyped ? "/** @type{string|number|boolean|Array|undefined} */(" : "",
          "typeclose", untyped ? ")" : "", "oneofgroup",
          (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                     : ""),
          "rptvalueinit", (field->is_repeated() ? " || []" : ""));
    }

    if (untyped) {
      printer->Print(
          "/**\n"
          " * Clears the value.\n"
          " * @return {!$class$} returns this\n"
          " */\n",
          "class", GetMessagePath(options, field->containing_type()));
    }

    if (field->is_repeated()) {
      GenerateRepeatedPrimitiveHelperMethods(options, printer, field, untyped);
    }
  }

  // Generate clearFoo() method for map fields, repeated fields, and other
  // fields with presence.
  if (field->is_map()) {
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears values from the map. The map will be non-null.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  this.$gettername$().clear();\n"
        "  return this;"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "gettername", "get" + JSGetterName(options, field));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (field->is_repeated() ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
              !field->is_required())) {
    // Fields where we can delegate to the regular setter.
    // clang-format off
    printer->Print(
        "/**\n"
        " * $jsdoc$\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return this.$settername$($clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
       "jsdoc", field->is_repeated()
           ? "Clears the list making it empty but non-null."
           : "Clears the message field making it undefined.",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "settername", "set" + JSGetterName(options, field),
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (HasFieldPresence(options, field)) {
    // Fields where we can't delegate to the regular setter because it doesn't
    // accept "undefined" as an argument.
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears the field making it undefined.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return jspb.Message.set$maybeoneof$Field(this, "
            "$index$$maybeoneofgroup$, ",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "maybeoneof", (field->containing_oneof() ? "Oneof" : ""),
        "maybeoneofgroup", (field->containing_oneof()
                            ? (", " + JSOneofArray(options, field))
                            : ""),
        "index", JSFieldIndex(field));
    // clang-format on
    printer->Annotate("clearername", field);
    printer->Print(
        "$clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
  }

  if (HasFieldPresence(options, field)) {
    printer->Print(
        "/**\n"
        " * Returns whether this field is set.\n"
        " * @return {boolean}\n"
        " */\n"
        "$class$.prototype.$hasername$ = function() {\n"
        "  return jspb.Message.getField(this, $index$) != null;\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()), "hasername",
        "has" + JSGetterName(options, field), "index", JSFieldIndex(field));
    printer->Annotate("hasername", field);
  }
}